

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 uVar63;
  undefined4 extraout_EAX;
  int iVar64;
  ulong uVar65;
  ulong uVar66;
  secp256k1_gej *psVar67;
  int64_t iVar68;
  int64_t iVar69;
  secp256k1_modinv64_signed62 *psVar70;
  byte bVar71;
  undefined4 uVar72;
  int iVar73;
  uint uVar74;
  secp256k1_gej *psVar75;
  secp256k1_gej *psVar76;
  secp256k1_scalar *r_00;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong *extraout_RDX;
  long lVar82;
  long lVar83;
  long lVar84;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar85;
  secp256k1_gej *psVar86;
  long lVar87;
  ulong uVar88;
  secp256k1_modinv64_signed62 *psVar89;
  secp256k1_gej *psVar90;
  secp256k1_gej *psVar91;
  secp256k1_gej *psVar92;
  secp256k1_modinv64_signed62 *psVar93;
  uint uVar94;
  uint uVar95;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar96;
  secp256k1_modinv64_signed62 *a_02;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  secp256k1_gej *psVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  secp256k1_gej *psVar110;
  uint64_t *puVar111;
  long lVar112;
  undefined1 *puVar113;
  secp256k1_gej *psVar114;
  long lVar115;
  ulong uVar116;
  secp256k1_gej *psVar117;
  long lVar118;
  ulong uVar119;
  ulong uVar120;
  long lVar121;
  secp256k1_gej *psVar122;
  bool bVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 sStack_478;
  secp256k1_modinv64_signed62 sStack_450;
  secp256k1_gej *psStack_428;
  secp256k1_gej *psStack_420;
  secp256k1_gej *psStack_418;
  ulong uStack_410;
  secp256k1_gej *psStack_408;
  ulong uStack_400;
  secp256k1_gej *psStack_3f8;
  secp256k1_gej *psStack_3f0;
  long lStack_3e8;
  secp256k1_gej *psStack_3e0;
  secp256k1_gej *psStack_3d8;
  secp256k1_gej *psStack_3d0;
  uint64_t uStack_3c8;
  secp256k1_gej *psStack_3c0;
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  uint64_t uStack_3a0;
  secp256k1_gej *psStack_398;
  secp256k1_gej *psStack_390;
  secp256k1_gej *psStack_388;
  secp256k1_gej *psStack_380;
  secp256k1_gej *psStack_378;
  secp256k1_gej *psStack_370;
  long lStack_368;
  secp256k1_gej *psStack_360;
  code *pcStack_358;
  uint uStack_34c;
  secp256k1_gej *psStack_348;
  secp256k1_gej *apsStack_340 [2];
  undefined1 auStack_330 [56];
  uint64_t uStack_2f8;
  uint64_t uStack_2f0;
  uint64_t uStack_2e8;
  uint64_t uStack_2e0;
  secp256k1_modinv64_trans2x2 sStack_2d0;
  undefined1 auStack_2b0 [96];
  ulong uStack_250;
  ulong uStack_248;
  secp256k1_gej *psStack_240;
  ulong uStack_238;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_220;
  secp256k1_gej *psStack_218;
  secp256k1_gej *psStack_208;
  secp256k1_fe *psStack_200;
  secp256k1_fe sStack_1f8;
  ulong uStack_1c8;
  ulong uStack_1c0;
  code *pcStack_1b8;
  ulong uStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  ulong uStack_190;
  ulong uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  undefined1 auStack_b0 [16];
  secp256k1_scalar *psStack_98;
  ulong uStack_90;
  ulong uStack_88;
  secp256k1_modinv64_signed62 *psStack_80;
  ulong uStack_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  secp256k1_modinv64_signed62 local_58;
  secp256k1_fe *a_00;
  
  pcStack_70 = (code *)0x142137;
  secp256k1_scalar_verify(x);
  local_68 = x->d[2] | x->d[0];
  uStack_60 = x->d[3] | x->d[1];
  pcStack_70 = (code *)0x14214f;
  secp256k1_scalar_verify(x);
  uVar116 = x->d[0];
  uVar119 = x->d[1];
  uVar66 = x->d[2];
  uVar88 = x->d[3];
  pcStack_70 = (code *)0x142166;
  secp256k1_scalar_verify(x);
  uVar72 = 0xffffffff;
  uVar120 = uVar116 & 0x3fffffffffffffff;
  uVar116 = (uVar119 & 0xfffffffffffffff) << 2 | uVar116 >> 0x3e;
  uVar119 = (uVar66 & 0x3ffffffffffffff) << 4 | uVar119 >> 0x3c;
  local_58.v[3] = (uVar88 & 0xffffffffffffff) << 6 | uVar66 >> 0x3a;
  uVar88 = uVar88 >> 0x38;
  pcStack_70 = (code *)0x1421b9;
  local_58.v[0] = uVar120;
  local_58.v[1] = uVar116;
  local_58.v[2] = uVar119;
  local_58.v[4] = uVar88;
  secp256k1_modinv64_var(&local_58,&secp256k1_const_modinfo_scalar);
  pcStack_70 = (code *)0x1421c4;
  psVar89 = &local_58;
  secp256k1_scalar_from_signed62(r,&local_58);
  pcStack_70 = (code *)0x1421cc;
  secp256k1_scalar_verify(r);
  pcStack_70 = (code *)0x1421d4;
  psVar122 = (secp256k1_gej *)r;
  secp256k1_scalar_verify(r);
  auVar124._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar124._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar124._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar124._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar64 = movmskps(extraout_EAX,auVar124);
  auVar125._0_4_ = -(uint)((int)local_68 == 0);
  auVar125._4_4_ = -(uint)(local_68._4_4_ == 0);
  auVar125._8_4_ = -(uint)((int)uStack_60 == 0);
  auVar125._12_4_ = -(uint)(uStack_60._4_4_ == 0);
  iVar73 = movmskps(uVar72,auVar125);
  if ((iVar73 != 0xf) != (iVar64 == 0xf)) {
    return;
  }
  pcStack_70 = secp256k1_scalar_mul;
  secp256k1_scalar_inverse_var_cold_1();
  pcStack_1b8 = (code *)0x14223e;
  psStack_98 = r;
  uStack_90 = uVar116;
  uStack_88 = uVar119;
  psStack_80 = &local_58;
  uStack_78 = uVar120;
  pcStack_70 = (code *)uVar88;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar89);
  pcStack_1b8 = (code *)0x142246;
  secp256k1_scalar_verify(r_00);
  uVar116 = psVar89->v[0];
  uVar119 = psVar89->v[1];
  uVar66 = psVar89->v[2];
  uVar88 = r_00->d[0];
  uVar120 = r_00->d[1];
  uVar109 = r_00->d[2];
  uVar104 = r_00->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar116;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar88;
  uVar77 = SUB168(auVar5 * auVar21,8);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar77;
  uStack_e0 = SUB168(auVar5 * auVar21,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar116;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar120;
  auVar6 = auVar6 * auVar22;
  uVar97 = SUB168(auVar6 + auVar60,0);
  uVar102 = SUB168(auVar6 + auVar60,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar119;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar88;
  uVar78 = SUB168(auVar7 * auVar23,8);
  uVar65 = SUB168(auVar7 * auVar23,0);
  uStack_d8 = uVar97 + uVar65;
  uVar65 = (ulong)CARRY8(uVar97,uVar65);
  uVar97 = uVar102 + uVar78;
  uVar103 = uVar97 + uVar65;
  uVar105 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar77,auVar6._0_8_)) +
            (ulong)(CARRY8(uVar102,uVar78) || CARRY8(uVar97,uVar65));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar116;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar109;
  uVar79 = SUB168(auVar8 * auVar24,8);
  uVar65 = SUB168(auVar8 * auVar24,0);
  uVar77 = uVar103 + uVar65;
  uVar65 = (ulong)CARRY8(uVar103,uVar65);
  uVar78 = uVar105 + uVar79;
  uVar106 = uVar78 + uVar65;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar119;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar120;
  uVar80 = SUB168(auVar9 * auVar25,8);
  uVar97 = SUB168(auVar9 * auVar25,0);
  uVar103 = uVar77 + uVar97;
  uVar97 = (ulong)CARRY8(uVar77,uVar97);
  uVar102 = uVar106 + uVar80;
  uVar107 = uVar102 + uVar97;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar66;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar88;
  uVar81 = SUB168(auVar10 * auVar26,8);
  uVar77 = SUB168(auVar10 * auVar26,0);
  uStack_d0 = uVar103 + uVar77;
  uVar77 = (ulong)CARRY8(uVar103,uVar77);
  uVar103 = uVar107 + uVar81;
  uVar108 = uVar103 + uVar77;
  uVar107 = (ulong)(CARRY8(uVar105,uVar79) || CARRY8(uVar78,uVar65)) +
            (ulong)(CARRY8(uVar106,uVar80) || CARRY8(uVar102,uVar97)) +
            (ulong)(CARRY8(uVar107,uVar81) || CARRY8(uVar103,uVar77));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar116;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar104;
  uVar80 = SUB168(auVar11 * auVar27,8);
  uVar116 = SUB168(auVar11 * auVar27,0);
  uVar77 = uVar108 + uVar116;
  uVar65 = (ulong)CARRY8(uVar108,uVar116);
  uVar78 = uVar107 + uVar80;
  uVar108 = uVar78 + uVar65;
  uVar116 = psVar89->v[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar119;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar109;
  uVar81 = SUB168(auVar12 * auVar28,8);
  uVar97 = SUB168(auVar12 * auVar28,0);
  uVar103 = uVar77 + uVar97;
  uVar97 = (ulong)CARRY8(uVar77,uVar97);
  uVar102 = uVar108 + uVar81;
  uVar98 = uVar102 + uVar97;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar66;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar120;
  uVar105 = SUB168(auVar13 * auVar29,8);
  uVar77 = SUB168(auVar13 * auVar29,0);
  uVar79 = uVar103 + uVar77;
  uVar77 = (ulong)CARRY8(uVar103,uVar77);
  uVar103 = uVar98 + uVar105;
  uVar99 = uVar103 + uVar77;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar116;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar88;
  uVar106 = SUB168(auVar14 * auVar30,8);
  uVar88 = SUB168(auVar14 * auVar30,0);
  uStack_c8 = uVar79 + uVar88;
  uVar88 = (ulong)CARRY8(uVar79,uVar88);
  uVar79 = uVar99 + uVar106;
  uVar100 = uVar79 + uVar88;
  uVar80 = (ulong)(CARRY8(uVar107,uVar80) || CARRY8(uVar78,uVar65)) +
           (ulong)(CARRY8(uVar108,uVar81) || CARRY8(uVar102,uVar97)) +
           (ulong)(CARRY8(uVar98,uVar105) || CARRY8(uVar103,uVar77)) +
           (ulong)(CARRY8(uVar99,uVar106) || CARRY8(uVar79,uVar88));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar119;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar104;
  uVar102 = SUB168(auVar15 * auVar31,8);
  uVar88 = SUB168(auVar15 * auVar31,0);
  uVar77 = uVar100 + uVar88;
  uVar88 = (ulong)CARRY8(uVar100,uVar88);
  uVar97 = uVar80 + uVar102;
  uVar81 = uVar97 + uVar88;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar66;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar109;
  uVar103 = SUB168(auVar16 * auVar32,8);
  uVar65 = SUB168(auVar16 * auVar32,0);
  uVar78 = uVar77 + uVar65;
  uVar65 = (ulong)CARRY8(uVar77,uVar65);
  uVar77 = uVar81 + uVar103;
  uVar105 = uVar77 + uVar65;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar116;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar120;
  uVar79 = SUB168(auVar17 * auVar33,8);
  uVar120 = SUB168(auVar17 * auVar33,0);
  uStack_c0 = uVar78 + uVar120;
  uVar120 = (ulong)CARRY8(uVar78,uVar120);
  uVar78 = uVar105 + uVar79;
  uVar106 = uVar78 + uVar120;
  uVar78 = (ulong)(CARRY8(uVar80,uVar102) || CARRY8(uVar97,uVar88)) +
           (ulong)(CARRY8(uVar81,uVar103) || CARRY8(uVar77,uVar65)) +
           (ulong)(CARRY8(uVar105,uVar79) || CARRY8(uVar78,uVar120));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar66;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar104;
  uVar65 = SUB168(auVar18 * auVar34,8);
  uVar66 = SUB168(auVar18 * auVar34,0);
  uVar77 = uVar106 + uVar66;
  uVar66 = (ulong)CARRY8(uVar106,uVar66);
  uVar120 = uVar78 + uVar65;
  uVar102 = uVar120 + uVar66;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar116;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar109;
  uVar97 = SUB168(auVar19 * auVar35,8);
  uVar88 = SUB168(auVar19 * auVar35,0);
  uStack_b8 = uVar77 + uVar88;
  uVar88 = (ulong)CARRY8(uVar77,uVar88);
  uVar109 = uVar102 + uVar97;
  auVar53._8_8_ =
       (ulong)(CARRY8(uVar78,uVar65) || CARRY8(uVar120,uVar66)) +
       (ulong)(CARRY8(uVar102,uVar97) || CARRY8(uVar109,uVar88));
  auVar53._0_8_ = uVar109 + uVar88;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar116;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar104;
  auStack_b0 = auVar20 * auVar36 + auVar53;
  uVar63 = auStack_b0._8_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uStack_e0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uStack_c0;
  auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
  uStack_150 = auVar54._0_8_;
  uVar66 = auVar54._8_8_;
  uVar120 = uVar66 + uStack_d8;
  uVar66 = (ulong)CARRY8(uVar66,uStack_d8);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_b8;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar88 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar104 = uVar120 + uVar88;
  uVar88 = (ulong)CARRY8(uVar120,uVar88);
  uVar109 = uVar66 + uVar65;
  uVar77 = uVar109 + uVar88;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_c0;
  uVar97 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  uStack_158 = uVar104 + uVar120;
  uVar120 = (ulong)CARRY8(uVar104,uVar120);
  uVar104 = uVar77 + uVar97;
  uVar102 = uVar104 + uVar120;
  uVar78 = (ulong)(CARRY8(uVar66,uVar65) || CARRY8(uVar109,uVar88)) +
           (ulong)(CARRY8(uVar77,uVar97) || CARRY8(uVar104,uVar120));
  uVar120 = uVar102 + uStack_d0;
  uVar66 = (ulong)CARRY8(uVar102,uStack_d0);
  uVar102 = uVar78 + uVar66;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auStack_b0._0_8_;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar88 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar109 = uVar120 + uVar88;
  uVar88 = (ulong)CARRY8(uVar120,uVar88);
  uVar104 = uVar102 + uVar97;
  uVar103 = uVar104 + uVar88;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uStack_b8;
  uVar77 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar80 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar65 = uVar103 + uVar77;
  uVar79 = uVar65 + uVar120;
  uStack_160 = uVar80 + uStack_c0;
  uVar109 = (ulong)CARRY8(uVar80,uStack_c0);
  uVar80 = uVar79 + uVar109;
  uVar102 = (ulong)CARRY8(uVar78,uVar66) + (ulong)(CARRY8(uVar102,uVar97) || CARRY8(uVar104,uVar88))
            + (ulong)(CARRY8(uVar103,uVar77) || CARRY8(uVar65,uVar120)) +
            (ulong)CARRY8(uVar79,uVar109);
  uVar120 = uVar80 + uStack_c8;
  uVar66 = (ulong)CARRY8(uVar80,uStack_c8);
  uVar103 = uVar102 + uVar66;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auStack_b0._8_8_;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar88 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar109 = uVar120 + uVar88;
  uVar88 = (ulong)CARRY8(uVar120,uVar88);
  uVar104 = uVar103 + uVar97;
  uVar79 = uVar104 + uVar88;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auStack_b0._0_8_;
  uVar77 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar78 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar65 = uVar79 + uVar77;
  uVar80 = uVar65 + uVar120;
  uStack_168 = uVar78 + uStack_b8;
  uVar109 = (ulong)CARRY8(uVar78,uStack_b8);
  uVar78 = uVar80 + uVar109;
  uVar104 = (ulong)CARRY8(uVar102,uVar66) +
            (ulong)(CARRY8(uVar103,uVar97) || CARRY8(uVar104,uVar88)) +
            (ulong)(CARRY8(uVar79,uVar77) || CARRY8(uVar65,uVar120)) + (ulong)CARRY8(uVar80,uVar109)
  ;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auStack_b0._8_8_;
  uVar109 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
  uVar66 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
  uVar88 = uVar78 + uVar66;
  uVar66 = (ulong)CARRY8(uVar78,uVar66);
  uVar120 = uVar104 + uVar109;
  uVar65 = uVar120 + uVar66;
  auVar61._8_8_ = uVar65;
  auVar61._0_8_ = uVar88;
  uStack_170 = SUB168(auStack_b0 + auVar61,0);
  uVar88 = (ulong)CARRY8(uVar88,auStack_b0._0_8_);
  uVar105 = SUB168(auStack_b0 + auVar61,8);
  uVar78 = (ulong)(CARRY8(uVar104,uVar109) || CARRY8(uVar120,uVar66)) + (ulong)CARRY8(uVar65,uVar88)
           + (ulong)CARRY8(uVar65 + uVar88,auStack_b0._8_8_);
  auVar59._8_8_ = uVar78;
  auVar59._0_8_ = uVar105;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uStack_150;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uStack_170;
  auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
  uStack_188 = auVar55._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uStack_188;
  uVar66 = auVar55._8_8_;
  uVar120 = uVar66 + uStack_158;
  uVar66 = (ulong)CARRY8(uVar66,uStack_158);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar105;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar88 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar104 = uVar120 + uVar88;
  uVar88 = (ulong)CARRY8(uVar120,uVar88);
  uVar109 = uVar66 + uVar65;
  uVar77 = uVar109 + uVar88;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uStack_170;
  uVar97 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  uStack_190 = uVar104 + uVar120;
  uVar120 = (ulong)CARRY8(uVar104,uVar120);
  uVar104 = uVar77 + uVar97;
  uVar103 = uVar104 + uVar120;
  uVar102 = (ulong)(CARRY8(uVar66,uVar65) || CARRY8(uVar109,uVar88)) +
            (ulong)(CARRY8(uVar77,uVar97) || CARRY8(uVar104,uVar120));
  uVar120 = uVar103 + uStack_160;
  uVar66 = (ulong)CARRY8(uVar103,uStack_160);
  uVar103 = uVar102 + uVar66;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar78;
  uVar97 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
  uVar88 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
  uVar109 = uVar120 + uVar88;
  uVar88 = (ulong)CARRY8(uVar120,uVar88);
  uVar104 = uVar103 + uVar97;
  uVar79 = uVar104 + uVar88;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar105;
  uVar77 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
  uVar120 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
  uVar81 = uVar109 + uVar120;
  uVar120 = (ulong)CARRY8(uVar109,uVar120);
  uVar65 = uVar79 + uVar77;
  uVar80 = uVar65 + uVar120;
  uStack_198 = uVar81 + uStack_170;
  uVar109 = (ulong)CARRY8(uVar81,uStack_170);
  uVar81 = uVar80 + uVar109;
  auVar56._8_8_ =
       (ulong)CARRY8(uVar102,uVar66) + (ulong)(CARRY8(uVar103,uVar97) || CARRY8(uVar104,uVar88)) +
       (ulong)(CARRY8(uVar79,uVar77) || CARRY8(uVar65,uVar120)) + (ulong)CARRY8(uVar80,uVar109) +
       (ulong)CARRY8(uVar81,uStack_168);
  auVar56._0_8_ = uVar81 + uStack_168;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar78;
  auVar59 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar59;
  uStack_1a0 = auVar59._0_8_;
  uStack_1a8 = auVar59._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uStack_1a8;
  auVar62 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar62;
  uVar66 = auVar62._8_8_;
  (psVar122->x).n[0] = auVar62._0_8_;
  auVar57[8] = CARRY8(uVar66,uStack_190);
  auVar57._0_8_ = uVar66 + uStack_190;
  auVar57._9_7_ = 0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uStack_1a8;
  auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
  uVar66 = auVar57._8_8_;
  (psVar122->x).n[1] = auVar57._0_8_;
  uVar88 = uVar66 + uStack_1a8;
  uVar109 = (ulong)CARRY8(uVar66,uStack_1a8) + (ulong)CARRY8(uVar88,uStack_198);
  (psVar122->x).n[2] = uVar88 + uStack_198;
  uVar120 = (ulong)CARRY8(uVar109,uStack_1a0);
  (psVar122->x).n[3] = uVar109 + uStack_1a0;
  uVar1 = (psVar122->x).n[3];
  uVar66 = (psVar122->x).n[2];
  uVar88 = (psVar122->x).n[1];
  uVar74 = (uint)((0xfffffffffffffffd < uVar66 && uVar1 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar88);
  uVar95 = 0;
  if (0xbaaedce6af48a03b < uVar88) {
    uVar95 = uVar74;
  }
  psVar90 = (secp256k1_gej *)(psVar122->x).n[0];
  uVar94 = 0;
  if ((secp256k1_gej *)0xbfd25e8cd0364140 < psVar90) {
    uVar94 = uVar74;
  }
  uStack_148._0_4_ = (uint)CARRY8(uVar109,uStack_1a0);
  uVar95 = (uVar94 | uVar95 | (uVar66 == 0xffffffffffffffff && uVar1 == 0xffffffffffffffff)) +
           (uint)uStack_148;
  a_00 = (secp256k1_fe *)(ulong)uVar95;
  uStack_180 = uVar78;
  uStack_178 = uVar105;
  uStack_148 = uVar120;
  uStack_140 = uStack_1a8;
  uStack_138 = uStack_1a0;
  uStack_130 = uStack_198;
  uStack_128 = uStack_190;
  uStack_120 = uStack_188;
  uStack_118 = uVar78;
  uStack_110 = uVar105;
  uStack_108 = uStack_170;
  uStack_100 = uStack_168;
  uStack_f8 = uStack_160;
  uStack_f0 = uStack_158;
  uStack_e8 = uStack_150;
  if (uVar95 < 2) {
    uVar120 = (ulong)uVar95;
    uVar116 = (ulong)CARRY8(uVar120 * 0x402da1732fc9bebf,(ulong)psVar90);
    uVar119 = uVar120 * 0x4551231950b75fc4 + uVar88;
    (psVar122->x).n[0] = uVar120 * 0x402da1732fc9bebf + (long)psVar90;
    (psVar122->x).n[1] = uVar119 + uVar116;
    uVar116 = (ulong)(CARRY8(uVar120 * 0x4551231950b75fc4,uVar88) || CARRY8(uVar119,uVar116));
    (psVar122->x).n[2] = uVar66 + uVar120 + uVar116;
    (psVar122->x).n[3] = uVar1 + (CARRY8(uVar66,uVar120) || CARRY8(uVar66 + uVar120,uVar116));
    pcStack_1b8 = (code *)0x1427b1;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar122);
    pcStack_1b8 = (code *)0x1427b9;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar122);
    return;
  }
  pcStack_1b8 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_mul_cold_1();
  uStack_1c0 = uVar63;
  psStack_200 = (secp256k1_fe *)0x1427e4;
  psVar92 = psVar90;
  uStack_1c8 = uVar119;
  pcStack_1b8 = (code *)uVar116;
  secp256k1_fe_verify(a_00);
  psStack_200 = (secp256k1_fe *)0x1427ec;
  psVar96 = psVar90;
  secp256k1_gej_verify(psVar90);
  if (psVar90->infinity == 0) {
    psStack_200 = (secp256k1_fe *)0x142804;
    secp256k1_fe_sqr(&sStack_1f8,&psVar90->z);
    psStack_200 = (secp256k1_fe *)0x142812;
    secp256k1_fe_mul(&sStack_1f8,&sStack_1f8,a_00);
    psStack_200 = (secp256k1_fe *)0x14281d;
    secp256k1_fe_equal(&sStack_1f8,&psVar90->x);
    return;
  }
  psStack_200 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_218 = (secp256k1_gej *)0x14283b;
  psVar91 = psVar92;
  psStack_208 = psVar90;
  psStack_200 = a_00;
  secp256k1_fe_verify(&psVar96->x);
  psStack_218 = (secp256k1_gej *)0x142843;
  psVar90 = psVar92;
  secp256k1_fe_verify(&psVar92->x);
  if ((psVar96->x).normalized == 0) {
    psStack_218 = (secp256k1_gej *)0x142885;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar92->x).normalized != 0) {
    uVar95 = 4;
    while( true ) {
      uVar116 = (psVar92->x).n[uVar95];
      uVar119 = (psVar96->x).n[uVar95];
      if (uVar119 >= uVar116 && uVar119 != uVar116) {
        return;
      }
      if (uVar119 < uVar116) break;
      bVar123 = uVar95 == 0;
      uVar95 = uVar95 - 1;
      if (bVar123) {
        return;
      }
    }
    return;
  }
  psStack_218 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_230 = (secp256k1_gej *)0x142899;
  psVar76 = psVar91;
  psStack_220 = psVar92;
  psStack_218 = psVar96;
  secp256k1_fe_verify(&psVar90->x);
  psStack_230 = (secp256k1_gej *)0x1428a1;
  psVar92 = psVar91;
  secp256k1_fe_verify(&psVar91->x);
  iVar64 = (psVar91->x).magnitude + (psVar90->x).magnitude;
  if (iVar64 < 0x21) {
    (psVar90->x).n[0] = (psVar90->x).n[0] + (psVar91->x).n[0];
    puVar111 = (psVar90->x).n + 1;
    *puVar111 = *puVar111 + (psVar91->x).n[1];
    puVar111 = (psVar90->x).n + 2;
    *puVar111 = *puVar111 + (psVar91->x).n[2];
    puVar111 = (psVar90->x).n + 3;
    *puVar111 = *puVar111 + (psVar91->x).n[3];
    puVar111 = (psVar90->x).n + 4;
    *puVar111 = *puVar111 + (psVar91->x).n[4];
    (psVar90->x).magnitude = iVar64;
    (psVar90->x).normalized = 0;
    secp256k1_fe_verify(&psVar90->x);
    return;
  }
  psStack_230 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  auStack_2b0._16_8_ = 0;
  auStack_2b0._24_8_ = 0;
  auStack_2b0._0_8_ = 0;
  auStack_2b0._8_8_ = 0;
  psVar96 = (secp256k1_gej *)0x0;
  auStack_2b0._32_8_ = 0;
  auStack_2b0._56_8_ = 0;
  auStack_2b0._80_8_ = 0;
  auStack_2b0._64_8_ = 0;
  auStack_2b0._72_8_ = 0;
  auStack_2b0._48_8_ = 1;
  uStack_2e0 = (psVar76->x).n[4];
  auStack_330._48_8_ = (psVar76->x).n[0];
  uStack_2f8 = (psVar76->x).n[1];
  uStack_2f0 = (psVar76->x).n[2];
  uStack_2e8 = (psVar76->x).n[3];
  auStack_330._32_8_ = (psVar92->x).n[4];
  auStack_330._0_8_ = (psVar92->x).n[0];
  auStack_330._8_8_ = (psVar92->x).n[1];
  auStack_330._16_8_ = (psVar92->x).n[2];
  auStack_330._24_8_ = (psVar92->x).n[3];
  lVar121 = -1;
  psVar85 = (secp256k1_gej *)0x5;
  psStack_348 = psVar92;
  apsStack_340[0] = psVar76;
  auStack_2b0._88_8_ = psVar90;
  uStack_250 = uVar105;
  uStack_248 = uVar78;
  psStack_240 = psVar91;
  uStack_238 = uVar116;
  psStack_230 = psVar122;
  do {
    psVar90 = (secp256k1_gej *)auStack_330._48_8_;
    psVar86 = apsStack_340[0];
    uStack_34c = (uint)psVar85;
    psVar67 = (secp256k1_gej *)0x0;
    psVar110 = (secp256k1_gej *)0x0;
    psVar101 = (secp256k1_gej *)0x1;
    uVar95 = 0x3e;
    psVar91 = (secp256k1_gej *)0x1;
    puVar113 = (undefined1 *)auStack_330._0_8_;
    psVar92 = (secp256k1_gej *)auStack_330._48_8_;
    while( true ) {
      a_01 = (secp256k1_gej *)(-1L << ((byte)uVar95 & 0x3f) | (ulong)puVar113);
      psVar75 = (secp256k1_gej *)0x0;
      if (a_01 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_01 >> (long)psVar75 & 1) == 0;
            psVar75 = (secp256k1_gej *)((long)(psVar75->x).n + 1)) {
        }
      }
      bVar71 = (byte)psVar75;
      psVar114 = (secp256k1_gej *)((ulong)puVar113 >> (bVar71 & 0x3f));
      psVar91 = (secp256k1_gej *)((long)psVar91 << (bVar71 & 0x3f));
      psVar67 = (secp256k1_gej *)((long)psVar67 << (bVar71 & 0x3f));
      lVar121 = lVar121 - (long)psVar75;
      uVar95 = uVar95 - (int)psVar75;
      apsStack_340[1] = psVar96;
      if (uVar95 == 0) break;
      if (((ulong)psVar92 & 1) == 0) {
        pcStack_358 = (code *)0x142e13;
        secp256k1_modinv64_var_cold_8();
LAB_00142e13:
        pcStack_358 = (code *)0x142e18;
        secp256k1_modinv64_var_cold_7();
LAB_00142e18:
        pcStack_358 = (code *)0x142e1d;
        secp256k1_modinv64_var_cold_1();
LAB_00142e1d:
        pcStack_358 = (code *)0x142e22;
        secp256k1_modinv64_var_cold_2();
LAB_00142e22:
        pcStack_358 = (code *)0x142e27;
        secp256k1_modinv64_var_cold_6();
        psVar114 = psVar92;
        goto LAB_00142e27;
      }
      if (((ulong)psVar114 & 1) == 0) goto LAB_00142e13;
      a_01 = (secp256k1_gej *)
             ((long)psVar67 * auStack_330._0_8_ + (long)psVar91 * auStack_330._48_8_);
      psVar75 = (secp256k1_gej *)(ulong)(0x3e - uVar95);
      bVar71 = (byte)(0x3e - uVar95);
      psVar85 = (secp256k1_gej *)((long)psVar92 << (bVar71 & 0x3f));
      if (a_01 != psVar85) goto LAB_00142e18;
      psVar85 = (secp256k1_gej *)
                ((long)psVar101 * auStack_330._0_8_ + (long)psVar110 * auStack_330._48_8_);
      a_01 = (secp256k1_gej *)((long)psVar114 << (bVar71 & 0x3f));
      if (psVar85 != a_01) goto LAB_00142e1d;
      psVar75 = (secp256k1_gej *)(lVar121 - 0x2ea);
      if (psVar75 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_00142e22;
      iVar64 = (int)psVar114;
      if (lVar121 < 0) {
        lVar121 = -lVar121;
        uVar74 = (int)lVar121 + 1;
        if ((int)uVar95 <= (int)uVar74) {
          uVar74 = uVar95;
        }
        psVar75 = (secp256k1_gej *)(ulong)uVar74;
        a_01 = (secp256k1_gej *)(ulong)(uVar74 - 0x3f);
        if (0xffffffc1 < uVar74 - 0x3f) {
          psVar117 = (secp256k1_gej *)-(long)psVar67;
          psVar122 = (secp256k1_gej *)-(long)psVar91;
          psVar75 = (secp256k1_gej *)-(long)psVar92;
          psVar85 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar74 & 0x3fU)) >> (-(char)uVar74 & 0x3fU));
          uVar74 = (iVar64 * iVar64 + 0x3e) * iVar64 * (int)psVar75 & (uint)psVar85;
          psVar67 = psVar101;
          psVar91 = psVar110;
          psVar76 = psVar117;
          goto LAB_00142aed;
        }
        goto LAB_00142e31;
      }
      uVar74 = (int)lVar121 + 1;
      if ((int)uVar95 <= (int)uVar74) {
        uVar74 = uVar95;
      }
      psVar75 = (secp256k1_gej *)(ulong)uVar74;
      a_01 = (secp256k1_gej *)(ulong)(uVar74 - 0x3f);
      if (uVar74 - 0x3f < 0xffffffc2) goto LAB_00142e2c;
      psVar85 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar74 & 0x3fU)) >> (-(char)uVar74 & 0x3fU));
      uVar74 = -(iVar64 * (((int)psVar92 * 2 + 2U & 8) + (int)psVar92)) & (uint)psVar85;
      psVar122 = psVar110;
      psVar117 = psVar101;
      psVar75 = psVar114;
      psVar114 = psVar92;
LAB_00142aed:
      uVar116 = (ulong)uVar74;
      a_01 = (secp256k1_gej *)(uVar116 * (long)psVar114);
      puVar113 = (undefined1 *)((long)(psVar75->x).n + (long)(a_01->x).n);
      psVar110 = (secp256k1_gej *)((long)(psVar122->x).n + (long)psVar91 * uVar116);
      psVar75 = (secp256k1_gej *)(uVar116 * (long)psVar67);
      psVar101 = (secp256k1_gej *)((long)(psVar117->x).n + (long)(psVar75->x).n);
      psVar92 = psVar114;
      if (((ulong)puVar113 & (ulong)psVar85) != 0) {
LAB_00142e27:
        pcStack_358 = (code *)0x142e2c;
        secp256k1_modinv64_var_cold_4();
        psVar92 = psVar114;
LAB_00142e2c:
        pcStack_358 = (code *)0x142e31;
        secp256k1_modinv64_var_cold_3();
LAB_00142e31:
        pcStack_358 = (code *)0x142e36;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00142e36;
      }
    }
    a_01 = (secp256k1_gej *)((long)psVar67 * (long)psVar110);
    psVar75 = SUB168(SEXT816((long)psVar67) * SEXT816((long)psVar110),8);
    sStack_2d0.u = (int64_t)psVar91;
    sStack_2d0.v = (int64_t)psVar67;
    sStack_2d0.q = (int64_t)psVar110;
    sStack_2d0.r = (int64_t)psVar101;
    if ((long)psVar91 * (long)psVar101 - (long)a_01 != 0x4000000000000000 ||
        SUB168(SEXT816((long)psVar91) * SEXT816((long)psVar101),8) - (long)psVar75 !=
        (ulong)((secp256k1_gej *)((long)psVar91 * (long)psVar101) < a_01)) {
LAB_00142e36:
      pcStack_358 = (code *)0x142e3b;
      secp256k1_modinv64_var_cold_9();
      psVar86 = psVar76;
LAB_00142e3b:
      pcStack_358 = (code *)0x142e40;
      secp256k1_modinv64_var_cold_20();
LAB_00142e40:
      pcStack_358 = (code *)0x142e45;
      secp256k1_modinv64_var_cold_19();
LAB_00142e45:
      pcStack_358 = (code *)0x142e4a;
      secp256k1_modinv64_var_cold_18();
      psVar96 = psVar90;
LAB_00142e4a:
      pcStack_358 = (code *)0x142e4f;
      secp256k1_modinv64_var_cold_17();
LAB_00142e4f:
      pcStack_358 = (code *)0x142e54;
      secp256k1_modinv64_var_cold_14();
LAB_00142e54:
      pcStack_358 = (code *)0x142e59;
      secp256k1_modinv64_var_cold_13();
LAB_00142e59:
      pcStack_358 = (code *)0x142e5e;
      secp256k1_modinv64_var_cold_12();
LAB_00142e5e:
      pcStack_358 = (code *)0x142e63;
      secp256k1_modinv64_var_cold_11();
LAB_00142e63:
      pcStack_358 = (code *)0x142e68;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00142e68;
    }
    pcStack_358 = (code *)0x142b7b;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_2b0,
               (secp256k1_modinv64_signed62 *)(auStack_2b0 + 0x30),&sStack_2d0,
               (secp256k1_modinv64_modinfo *)apsStack_340[0]);
    uVar95 = uStack_34c;
    psVar92 = (secp256k1_gej *)(auStack_330 + 0x30);
    psVar85 = (secp256k1_gej *)(ulong)uStack_34c;
    psVar91 = (secp256k1_gej *)(ulong)uStack_34c;
    psVar75 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_358 = (code *)0x142b98;
    a_01 = psVar92;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar92,uStack_34c,
                        (secp256k1_modinv64_signed62 *)psVar86,-1);
    if (iVar64 < 1) goto LAB_00142e3b;
    psVar75 = (secp256k1_gej *)0x1;
    psVar91 = (secp256k1_gej *)(ulong)uVar95;
    pcStack_358 = (code *)0x142bb2;
    a_01 = psVar92;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar92,uVar95,
                        (secp256k1_modinv64_signed62 *)psVar86,1);
    if (0 < iVar64) goto LAB_00142e40;
    psVar90 = (secp256k1_gej *)auStack_330;
    psVar91 = (secp256k1_gej *)(ulong)uVar95;
    psVar75 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_358 = (code *)0x142bd3;
    a_01 = psVar90;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar90,uVar95,
                        (secp256k1_modinv64_signed62 *)psVar86,-1);
    if (iVar64 < 1) goto LAB_00142e45;
    psVar75 = (secp256k1_gej *)0x1;
    psVar91 = (secp256k1_gej *)(ulong)uVar95;
    pcStack_358 = (code *)0x142bed;
    a_01 = psVar90;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar90,uVar95,
                        (secp256k1_modinv64_signed62 *)psVar86,1);
    psVar96 = psVar90;
    if (-1 < iVar64) goto LAB_00142e4a;
    pcStack_358 = (code *)0x142c0a;
    secp256k1_modinv64_update_fg_62_var
              (uVar95,(secp256k1_modinv64_signed62 *)psVar92,(secp256k1_modinv64_signed62 *)psVar90,
               &sStack_2d0);
    psVar96 = apsStack_340[1];
    if ((undefined1 *)auStack_330._0_8_ != (undefined1 *)0x0) {
LAB_00142c1b:
      lVar82 = (long)(int)uVar95;
      uVar116 = *(ulong *)(auStack_330 + lVar82 * 8 + 0x28);
      psVar75 = apsStack_340[lVar82 + 1];
      a_01 = (secp256k1_gej *)((long)uVar116 >> 0x3f ^ uVar116 | lVar82 + -2 >> 0x3f);
      psVar91 = (secp256k1_gej *)((long)psVar75 >> 0x3f ^ (ulong)psVar75 | (ulong)a_01);
      if (psVar91 == (secp256k1_gej *)0x0) {
        psVar85 = (secp256k1_gej *)(ulong)(uVar95 - 1);
        *(ulong *)(auStack_330 + lVar82 * 8 + 0x20) =
             *(ulong *)(auStack_330 + lVar82 * 8 + 0x20) | uVar116 << 0x3e;
        psVar75 = (secp256k1_gej *)((long)psVar75 << 0x3e);
        apsStack_340[lVar82] = (secp256k1_gej *)((ulong)apsStack_340[lVar82] | (ulong)psVar75);
      }
      if (10 < (int)psVar96) goto LAB_00142e4f;
      psVar75 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_358 = (code *)0x142c7e;
      iVar73 = (int)psVar85;
      psVar91 = psVar85;
      a_01 = psVar92;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar92,iVar73,
                          (secp256k1_modinv64_signed62 *)psVar86,-1);
      if (iVar64 < 1) goto LAB_00142e54;
      psVar75 = (secp256k1_gej *)0x1;
      pcStack_358 = (code *)0x142c98;
      psVar91 = psVar85;
      a_01 = psVar92;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar92,iVar73,
                          (secp256k1_modinv64_signed62 *)psVar86,1);
      if (0 < iVar64) goto LAB_00142e59;
      psVar92 = (secp256k1_gej *)auStack_330;
      psVar75 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_358 = (code *)0x142cb9;
      psVar91 = psVar85;
      a_01 = psVar92;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar92,iVar73,
                          (secp256k1_modinv64_signed62 *)psVar86,-1);
      if (iVar64 < 1) goto LAB_00142e5e;
      psVar75 = (secp256k1_gej *)0x1;
      pcStack_358 = (code *)0x142cd3;
      psVar91 = psVar85;
      a_01 = psVar92;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar92,iVar73,
                          (secp256k1_modinv64_signed62 *)psVar86,1);
      if (iVar64 < 0) {
        bVar123 = true;
        psVar96 = (secp256k1_gej *)(ulong)((int)psVar96 + 1);
        goto LAB_00142d08;
      }
      goto LAB_00142e63;
    }
    if (1 < (int)uVar95) {
      uVar116 = 1;
      uVar119 = 0;
      do {
        uVar119 = uVar119 | *(ulong *)(auStack_330 + uVar116 * 8);
        uVar116 = uVar116 + 1;
      } while (uVar95 != uVar116);
      if (uVar119 != 0) goto LAB_00142c1b;
    }
    bVar123 = false;
LAB_00142d08:
    psVar76 = psVar86;
  } while (bVar123);
  a_01 = (secp256k1_gej *)auStack_330;
  iVar73 = (int)psVar85;
  psVar75 = (secp256k1_gej *)0x0;
  pcStack_358 = (code *)0x142d25;
  psVar91 = psVar85;
  iVar64 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_01,iVar73,&SECP256K1_SIGNED62_ONE,0);
  if (iVar64 == 0) {
    pcStack_358 = (code *)0x142d47;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_330 + 0x30),iVar73,
                        &SECP256K1_SIGNED62_ONE,-1);
    psVar96 = psStack_348;
    if (iVar64 == 0) {
LAB_00142dc9:
      pcStack_358 = (code *)0x142de4;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_2b0,
                 *(int64_t *)(auStack_330 + (long)iVar73 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar86);
      (psVar96->x).n[4] = auStack_2b0._32_8_;
      (psVar96->x).n[2] = auStack_2b0._16_8_;
      (psVar96->x).n[3] = auStack_2b0._24_8_;
      (psVar96->x).n[0] = auStack_2b0._0_8_;
      (psVar96->x).n[1] = auStack_2b0._8_8_;
      return;
    }
    pcStack_358 = (code *)0x142d68;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_330 + 0x30),iVar73,
                        &SECP256K1_SIGNED62_ONE,1);
    if (iVar64 == 0) goto LAB_00142dc9;
    psVar91 = (secp256k1_gej *)0x5;
    psVar75 = (secp256k1_gej *)0x0;
    pcStack_358 = (code *)0x142d82;
    a_01 = psVar96;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar96,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar64 == 0) {
      a_01 = (secp256k1_gej *)auStack_2b0;
      psVar91 = (secp256k1_gej *)0x5;
      psVar75 = (secp256k1_gej *)0x0;
      pcStack_358 = (code *)0x142da5;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar64 == 0) {
        a_01 = (secp256k1_gej *)(auStack_330 + 0x30);
        psVar75 = (secp256k1_gej *)0x1;
        pcStack_358 = (code *)0x142dc1;
        psVar91 = psVar85;
        iVar64 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)a_01,iVar73,
                            (secp256k1_modinv64_signed62 *)psVar86,1);
        if (iVar64 == 0) goto LAB_00142dc9;
      }
    }
  }
  else {
LAB_00142e68:
    pcStack_358 = (code *)0x142e6d;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_358 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar116 = (psVar91->x).n[0];
  if (uVar116 >> 0x3e == 0) {
    uVar119 = (psVar91->x).n[1];
    if (0x3fffffffffffffff < uVar119) goto LAB_00142efc;
    psVar75 = (secp256k1_gej *)(psVar91->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar75) goto LAB_00142f01;
    uVar66 = (psVar91->x).n[3];
    if (0x3fffffffffffffff < uVar66) goto LAB_00142f06;
    psVar91 = (secp256k1_gej *)(psVar91->x).n[4];
    if (psVar91 < (secp256k1_gej *)&DAT_00000100) {
      (a_01->x).n[0] = uVar119 << 0x3e | uVar116;
      (a_01->x).n[1] = (long)psVar75 << 0x3c | uVar119 >> 2;
      (a_01->x).n[2] = uVar66 << 0x3a | (ulong)psVar75 >> 4;
      (a_01->x).n[3] = (long)psVar91 << 0x38 | uVar66 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_360 = (secp256k1_gej *)0x142efc;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00142efc:
    psStack_360 = (secp256k1_gej *)0x142f01;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00142f01:
    psStack_360 = (secp256k1_gej *)0x142f06;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00142f06:
    psStack_360 = (secp256k1_gej *)0x142f0b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_360 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_360 = psVar122;
  lStack_368 = lVar121;
  psStack_370 = psVar96;
  psStack_378 = psVar92;
  psStack_380 = psVar86;
  psStack_388 = psVar85;
  uVar1 = (a_01->x).n[0];
  psStack_398 = (secp256k1_gej *)(a_01->x).n[1];
  psStack_3a8 = (secp256k1_gej *)(a_01->x).n[2];
  uStack_3c8 = (a_01->x).n[3];
  psStack_3b8 = (secp256k1_gej *)(a_01->x).n[4];
  psVar122 = (secp256k1_gej *)(psVar91->x).n[0];
  psStack_390 = (secp256k1_gej *)(psVar91->x).n[1];
  uStack_3a0 = (psVar91->x).n[2];
  uStack_400 = *extraout_RDX;
  psStack_3f8 = (secp256k1_gej *)extraout_RDX[1];
  uStack_410 = extraout_RDX[2];
  psStack_408 = (secp256k1_gej *)extraout_RDX[3];
  psVar90 = (secp256k1_gej *)(psVar91->x).n[3];
  psStack_3c0 = (secp256k1_gej *)(psVar91->x).n[4];
  psVar92 = (secp256k1_gej *)0x5;
  psVar76 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_418 = (secp256k1_gej *)0x142fac;
  psVar96 = a_01;
  iVar64 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar75,
                      -2);
  if (iVar64 < 1) {
    psStack_418 = (secp256k1_gej *)0x143acc;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00143acc:
    psStack_418 = (secp256k1_gej *)0x143ad1;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00143ad1:
    psStack_418 = (secp256k1_gej *)0x143ad6;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00143ad6:
    psStack_418 = (secp256k1_gej *)0x143adb;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00143adb:
    psStack_418 = (secp256k1_gej *)0x143ae0;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00143ae0:
    psStack_418 = (secp256k1_gej *)0x143ae5;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00143ae5:
    psStack_418 = (secp256k1_gej *)0x143aea;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00143aea:
    psStack_418 = (secp256k1_gej *)0x143aef;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar85 = psVar75;
LAB_00143aef:
    psStack_418 = (secp256k1_gej *)0x143af4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00143af4:
    psStack_418 = (secp256k1_gej *)0x143af9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00143af9:
    psStack_418 = (secp256k1_gej *)0x143afe;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar86 = psVar85;
LAB_00143afe:
    psStack_418 = (secp256k1_gej *)0x143b03;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00143b03:
    psStack_418 = (secp256k1_gej *)0x143b08;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00143b08:
    psStack_418 = (secp256k1_gej *)0x143b0d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00143b0d:
    psStack_418 = (secp256k1_gej *)0x143b12;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00143b12:
    psStack_418 = (secp256k1_gej *)0x143b17;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00143b17:
    psStack_418 = (secp256k1_gej *)0x143b1c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00143b1c:
    psStack_418 = (secp256k1_gej *)0x143b21;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00143b21:
    psStack_418 = (secp256k1_gej *)0x143b26;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00143b26:
    psStack_418 = (secp256k1_gej *)0x143b2b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00143b2b:
    psStack_418 = (secp256k1_gej *)0x143b30;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00143b30:
    psVar90 = psVar122;
    psVar91 = a_01;
    psStack_418 = (secp256k1_gej *)0x143b35;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_00143b35:
    psStack_418 = (secp256k1_gej *)0x143b3a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00143b3a:
    psStack_418 = (secp256k1_gej *)0x143b3f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00143b3f:
    psStack_418 = (secp256k1_gej *)0x143b44;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00143b44:
    psStack_418 = (secp256k1_gej *)0x143b49;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00143b49:
    psStack_418 = (secp256k1_gej *)0x143b4e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00143b4e:
    psStack_418 = (secp256k1_gej *)0x143b53;
    secp256k1_modinv64_update_de_62_cold_23();
    a_01 = psVar91;
    psVar67 = psVar90;
LAB_00143b53:
    psStack_418 = (secp256k1_gej *)0x143b58;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00143b58:
    psStack_418 = (secp256k1_gej *)0x143b5d;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00143b5d:
    psStack_418 = (secp256k1_gej *)0x143b62;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00143b62:
    psVar85 = psVar76;
    psStack_418 = (secp256k1_gej *)0x143b67;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00143b67:
    uVar95 = (uint)psVar92;
    psStack_418 = (secp256k1_gej *)0x143b6c;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar76 = (secp256k1_gej *)0x1;
    psVar92 = (secp256k1_gej *)0x5;
    psStack_418 = (secp256k1_gej *)0x142fc9;
    psVar96 = a_01;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar75
                        ,1);
    if (-1 < iVar64) goto LAB_00143acc;
    psVar92 = (secp256k1_gej *)0x5;
    psVar76 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_418 = (secp256k1_gej *)0x142fe8;
    psVar96 = psVar91;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar91,5,
                        (secp256k1_modinv64_signed62 *)psVar75,-2);
    if (iVar64 < 1) goto LAB_00143ad1;
    psVar76 = (secp256k1_gej *)0x1;
    psVar92 = (secp256k1_gej *)0x5;
    psStack_418 = (secp256k1_gej *)0x143005;
    psVar96 = psVar91;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar91,5,
                        (secp256k1_modinv64_signed62 *)psVar75,1);
    if (-1 < iVar64) goto LAB_00143ad6;
    psStack_418 = (secp256k1_gej *)0x14302b;
    psStack_3d8 = a_01;
    psStack_3b0 = psVar90;
    iVar68 = secp256k1_modinv64_abs(uStack_400);
    psStack_418 = (secp256k1_gej *)0x143038;
    psVar96 = psStack_3f8;
    iVar69 = secp256k1_modinv64_abs((int64_t)psStack_3f8);
    psVar76 = (secp256k1_gej *)(0x4000000000000000 - iVar69);
    a_01 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar76 < iVar68) goto LAB_00143adb;
    psStack_418 = (secp256k1_gej *)0x143053;
    iVar68 = secp256k1_modinv64_abs(uStack_410);
    psStack_418 = (secp256k1_gej *)0x143060;
    psVar96 = psStack_408;
    iVar69 = secp256k1_modinv64_abs((int64_t)psStack_408);
    psVar90 = psStack_3d8;
    psVar76 = (secp256k1_gej *)(0x4000000000000000 - iVar69);
    if ((long)psVar76 < iVar68) goto LAB_00143ae0;
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar92 = (secp256k1_gej *)(uStack_400 * uVar1);
    psVar76 = SUB168(SEXT816((long)uStack_400) * SEXT816((long)uVar1),8);
    uVar116 = (long)psStack_3f8 * (long)psVar122;
    lVar82 = SUB168(SEXT816((long)psStack_3f8) * SEXT816((long)psVar122),8);
    lVar121 = (0x7fffffffffffffff - lVar82) - (long)psVar76;
    if (-1 < lVar82 &&
        (SBORROW8(0x7fffffffffffffff - lVar82,(long)psVar76) !=
        SBORROW8(lVar121,(ulong)((secp256k1_gej *)~uVar116 < psVar92))) !=
        (long)(lVar121 - (ulong)((secp256k1_gej *)~uVar116 < psVar92)) < 0) goto LAB_00143ae5;
    puVar111 = (uint64_t *)((long)(psVar92->x).n + uVar116);
    lVar112 = (long)(psVar76->x).n + (ulong)CARRY8(uVar116,(ulong)psVar92) + lVar82;
    uVar119 = uStack_410 * uVar1;
    lVar83 = SUB168(SEXT816((long)uStack_410) * SEXT816((long)uVar1),8);
    uVar66 = (long)psStack_408 * (long)psVar122;
    lVar84 = SUB168(SEXT816((long)psStack_408) * SEXT816((long)psVar122),8);
    uVar116 = (ulong)(-uVar66 - 1 < uVar119);
    lVar121 = (0x7fffffffffffffff - lVar84) - lVar83;
    lVar82 = lVar121 - uVar116;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar83) != SBORROW8(lVar121,uVar116)) ==
              lVar82 < 0;
    psVar76 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar82 >> 8),lVar84 < 0 || bVar123);
    if (lVar84 >= 0 && !bVar123) goto LAB_00143aea;
    psVar85 = (secp256k1_gej *)((long)psStack_3c0 >> 0x3f);
    lStack_3e8 = ((ulong)psStack_3f8 & (ulong)psVar85) + (uStack_400 & (long)psStack_3b8 >> 0x3f);
    uVar88 = uVar66 + uVar119;
    psVar96 = (secp256k1_gej *)(lVar84 + lVar83 + (ulong)CARRY8(uVar66,uVar119));
    uVar1 = (psVar75->x).n[0];
    psVar92 = *(secp256k1_gej **)&(psVar75->x).magnitude;
    psVar76 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_3e8 = lStack_3e8 - ((long)psVar92 * (long)puVar111 + lStack_3e8 & 0x3fffffffffffffffU);
    uVar119 = lStack_3e8 * uVar1;
    lVar82 = SUB168(SEXT816(lStack_3e8) * SEXT816((long)uVar1),8);
    uVar116 = (ulong)((undefined1 *)(-uVar119 - 1) < puVar111);
    lVar121 = (0x7fffffffffffffff - lVar82) - lVar112;
    psVar122 = (secp256k1_gej *)((-0x8000000000000000 - lVar82) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar82,lVar112) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar82 < 0) {
      bVar123 = (SBORROW8(lVar112,(long)psVar122) !=
                SBORROW8(lVar112 - (long)psVar122,(ulong)(puVar111 < (undefined1 *)-uVar119))) ==
                (long)((lVar112 - (long)psVar122) - (ulong)(puVar111 < (undefined1 *)-uVar119)) < 0;
    }
    psStack_3e0 = psVar91;
    psStack_3d0 = psVar75;
    if (!bVar123) goto LAB_00143aef;
    lVar121 = ((ulong)psVar85 & (ulong)psStack_408) + ((long)psStack_3b8 >> 0x3f & uStack_410);
    psVar85 = (secp256k1_gej *)(lVar121 - ((long)psVar92 * uVar88 + lVar121 & 0x3fffffffffffffff));
    lVar83 = lVar82 + lVar112 + (ulong)CARRY8(uVar119,(ulong)puVar111);
    uVar66 = (long)psVar85 * uVar1;
    lVar82 = SUB168(SEXT816((long)psVar85) * SEXT816((long)uVar1),8);
    uVar116 = (ulong)(-uVar66 - 1 < uVar88);
    lVar121 = (0x7fffffffffffffff - lVar82) - (long)psVar96;
    psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar82) - (ulong)(uVar66 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar82,(long)psVar96) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar82 < 0) {
      bVar123 = (SBORROW8((long)psVar96,(long)psVar92) !=
                SBORROW8((long)psVar96 - (long)psVar92,(ulong)(uVar88 < -uVar66))) ==
                (long)(((long)psVar96 - (long)psVar92) - (ulong)(uVar88 < -uVar66)) < 0;
    }
    if (!bVar123) goto LAB_00143af4;
    lVar121 = (long)(psVar96->x).n + (ulong)CARRY8(uVar66,uVar88) + lVar82;
    if (((long)puVar111 + uVar119 & 0x3fffffffffffffff) != 0) goto LAB_00143af9;
    psVar86 = psVar85;
    if ((uVar66 + uVar88 & 0x3fffffffffffffff) != 0) goto LAB_00143afe;
    psVar86 = (secp256k1_gej *)0x8000000000000000;
    uVar116 = (ulong)((long)puVar111 + uVar119) >> 0x3e | lVar83 * 4;
    psVar76 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar120 = uStack_400 * (long)psStack_398 + uVar116;
    psVar96 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_400) * SEXT816((long)psStack_398),8) + (lVar83 >> 0x3e) +
              (ulong)CARRY8(uStack_400 * (long)psStack_398,uVar116));
    uVar119 = (long)psStack_3f8 * (long)psStack_390;
    lVar84 = SUB168(SEXT816((long)psStack_3f8) * SEXT816((long)psStack_390),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar120);
    lVar82 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar119 != 0);
    lVar83 = (long)psVar96 - lVar112;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar82,uVar116)) ==
              (long)(lVar82 - uVar116) < 0;
    if (lVar84 < 0) {
      bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar83,(ulong)(uVar120 < -uVar119))) ==
                (long)(lVar83 - (ulong)(uVar120 < -uVar119)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    a_01 = psStack_398;
    psVar122 = psStack_390;
    psStack_3f0 = psVar85;
    if (bVar123 == false) goto LAB_00143b03;
    uVar116 = uVar66 + uVar88 >> 0x3e | lVar121 * 4;
    uVar66 = uVar120 + uVar119;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar120,uVar119) + lVar84);
    uVar88 = uStack_410 * (long)psStack_398 + uVar116;
    lVar84 = SUB168(SEXT816((long)uStack_410) * SEXT816((long)psStack_398),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_410 * (long)psStack_398,uVar116);
    uVar119 = (long)psStack_408 * (long)psStack_390;
    lVar83 = SUB168(SEXT816((long)psStack_408) * SEXT816((long)psStack_390),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar88);
    lVar121 = (0x7fffffffffffffff - lVar83) - lVar84;
    lVar112 = (-0x8000000000000000 - lVar83) - (ulong)(uVar119 != 0);
    lVar82 = lVar84 - lVar112;
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8(lVar84,lVar112) != SBORROW8(lVar82,(ulong)(uVar88 < -uVar119))) ==
                (long)(lVar82 - (ulong)(uVar88 < -uVar119)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b08;
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar116 = uVar88 + uVar119;
    lVar121 = lVar84 + lVar83 + (ulong)CARRY8(uVar88,uVar119);
    uVar1 = (psVar75->x).n[1];
    if (uVar1 != 0) {
      uVar88 = uVar1 * lStack_3e8;
      lVar83 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3e8),8);
      uVar119 = (ulong)(-uVar88 - 1 < uVar66);
      lVar82 = (0x7fffffffffffffff - lVar83) - (long)psVar96;
      psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar88 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
                (long)(lVar82 - uVar119) < 0;
      if (lVar83 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar92) !=
                  SBORROW8((long)psVar96 - (long)psVar92,(ulong)(uVar66 < -uVar88))) ==
                  (long)(((long)psVar96 - (long)psVar92) - (ulong)(uVar66 < -uVar88)) < 0;
      }
      psVar76 = psVar85;
      psVar67 = psStack_390;
      if (!bVar123) goto LAB_00143b53;
      uVar120 = uVar1 * (long)psVar85;
      lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar85),8);
      uVar119 = (ulong)(-uVar120 - 1 < uVar116);
      lVar82 = (0x7fffffffffffffff - lVar112) - lVar121;
      lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar120 != 0);
      lVar84 = lVar121 - lVar118;
      psVar67 = (secp256k1_gej *)(lVar84 - (ulong)(uVar116 < -uVar120));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar82,uVar119)) ==
                (long)(lVar82 - uVar119) < 0;
      if (lVar112 < 0) {
        bVar123 = (SBORROW8(lVar121,lVar118) != SBORROW8(lVar84,(ulong)(uVar116 < -uVar120))) ==
                  (long)psVar67 < 0;
      }
      psVar92 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 != false) {
        bVar123 = CARRY8(uVar66,uVar88);
        uVar66 = uVar66 + uVar88;
        psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar83);
        bVar123 = CARRY8(uVar116,uVar120);
        uVar116 = uVar116 + uVar120;
        lVar121 = lVar121 + lVar112 + (ulong)bVar123;
        goto LAB_00143427;
      }
      goto LAB_00143b58;
    }
LAB_00143427:
    uVar119 = (long)psVar96 << 2 | uVar66 >> 0x3e;
    uVar120 = uStack_400 * (long)psStack_3a8 + uVar119;
    psVar96 = (secp256k1_gej *)
              (((long)psVar96 >> 0x3e) +
               SUB168(SEXT816((long)uStack_400) * SEXT816((long)psStack_3a8),8) +
              (ulong)CARRY8(uStack_400 * (long)psStack_3a8,uVar119));
    uVar88 = (long)psStack_3f8 * uStack_3a0;
    lVar84 = SUB168(SEXT816((long)psStack_3f8) * SEXT816((long)uStack_3a0),8);
    uVar119 = (ulong)(-uVar88 - 1 < uVar120);
    lVar82 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar88 != 0);
    lVar83 = (long)psVar96 - lVar112;
    (psStack_3d8->x).n[0] = uVar66 & 0x3fffffffffffffff;
    (psVar91->x).n[0] = uVar116 & 0x3fffffffffffffff;
    bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar83,(ulong)(uVar120 < -uVar88))) ==
              (long)(lVar83 - (ulong)(uVar120 < -uVar88)) < 0;
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
             (long)(lVar82 - uVar119) < 0;
    if (lVar84 < 0) {
      bVar58 = bVar123;
    }
    psVar76 = psStack_3a8;
    psVar122 = psStack_3d8;
    if (!bVar58) goto LAB_00143b0d;
    uVar116 = uVar116 >> 0x3e | lVar121 << 2;
    uVar109 = uVar120 + uVar88;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar120,uVar88) + lVar84);
    uVar66 = uStack_410 * (long)psStack_3a8 + uVar116;
    lVar83 = SUB168(SEXT816((long)uStack_410) * SEXT816((long)psStack_3a8),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_410 * (long)psStack_3a8,uVar116);
    uVar119 = (long)psStack_408 * uStack_3a0;
    lVar82 = SUB168(SEXT816((long)psStack_408) * SEXT816((long)uStack_3a0),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar66);
    lVar121 = (0x7fffffffffffffff - lVar82) - lVar83;
    psVar76 = (secp256k1_gej *)0x8000000000000000;
    psVar86 = (secp256k1_gej *)((-0x8000000000000000 - lVar82) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar82,lVar83) != SBORROW8(lVar121,uVar116)) ==
              (long)(lVar121 - uVar116) < 0;
    if (lVar82 < 0) {
      bVar123 = (SBORROW8(lVar83,(long)psVar86) !=
                SBORROW8(lVar83 - (long)psVar86,(ulong)(uVar66 < -uVar119))) ==
                (long)((lVar83 - (long)psVar86) - (ulong)(uVar66 < -uVar119)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b12;
    uVar116 = uVar66 + uVar119;
    lVar121 = lVar83 + lVar82 + (ulong)CARRY8(uVar66,uVar119);
    uVar1 = (psVar75->x).n[2];
    if (uVar1 != 0) {
      uVar66 = uVar1 * lStack_3e8;
      lVar83 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3e8),8);
      uVar119 = (ulong)(-uVar66 - 1 < uVar109);
      lVar82 = (0x7fffffffffffffff - lVar83) - (long)psVar96;
      psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar66 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
                (long)(lVar82 - uVar119) < 0;
      if (lVar83 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar92) !=
                  SBORROW8((long)psVar96 - (long)psVar92,(ulong)(uVar109 < -uVar66))) ==
                  (long)(((long)psVar96 - (long)psVar92) - (ulong)(uVar109 < -uVar66)) < 0;
      }
      psVar67 = psStack_3d8;
      if (!bVar123) goto LAB_00143b5d;
      uVar88 = uVar1 * (long)psVar85;
      lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar85),8);
      uVar119 = (ulong)(-uVar88 - 1 < uVar116);
      lVar82 = (0x7fffffffffffffff - lVar112) - lVar121;
      lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar88 != 0);
      lVar84 = lVar121 - lVar118;
      psVar67 = (secp256k1_gej *)
                (ulong)((SBORROW8(lVar121,lVar118) != SBORROW8(lVar84,(ulong)(uVar116 < -uVar88)))
                       == (long)(lVar84 - (ulong)(uVar116 < -uVar88)) < 0);
      psVar92 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar82,uVar119))
                       == (long)(lVar82 - uVar119) < 0);
      if (lVar112 < 0) {
        psVar92 = psVar67;
      }
      if ((char)psVar92 != '\0') {
        bVar123 = CARRY8(uVar109,uVar66);
        uVar109 = uVar109 + uVar66;
        psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar83);
        bVar123 = CARRY8(uVar116,uVar88);
        uVar116 = uVar116 + uVar88;
        lVar121 = lVar121 + lVar112 + (ulong)bVar123;
        goto LAB_00143621;
      }
      goto LAB_00143b62;
    }
LAB_00143621:
    a_01 = (secp256k1_gej *)0x8000000000000000;
    psVar86 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar119 = (long)psVar96 << 2 | uVar109 >> 0x3e;
    uVar88 = uStack_400 * uStack_3c8 + uVar119;
    psVar96 = (secp256k1_gej *)
              (((long)psVar96 >> 0x3e) +
               SUB168(SEXT816((long)uStack_400) * SEXT816((long)uStack_3c8),8) +
              (ulong)CARRY8(uStack_400 * uStack_3c8,uVar119));
    uVar66 = (long)psStack_3f8 * (long)psStack_3b0;
    lVar84 = SUB168(SEXT816((long)psStack_3f8) * SEXT816((long)psStack_3b0),8);
    uVar119 = (ulong)(-uVar66 - 1 < uVar88);
    lVar82 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
    lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar66 != 0);
    lVar83 = (long)psVar96 - lVar112;
    (psStack_3d8->x).n[1] = uVar109 & 0x3fffffffffffffff;
    (psVar91->x).n[1] = uVar116 & 0x3fffffffffffffff;
    bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar83,(ulong)(uVar88 < -uVar66))) ==
              (long)(lVar83 - (ulong)(uVar88 < -uVar66)) < 0;
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
             (long)(lVar82 - uVar119) < 0;
    if (lVar84 < 0) {
      bVar58 = bVar123;
    }
    psVar76 = psStack_3b0;
    if (!bVar58) goto LAB_00143b17;
    uVar116 = uVar116 >> 0x3e | lVar121 << 2;
    uVar120 = uVar88 + uVar66;
    psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar88,uVar66) + lVar84);
    uVar66 = uStack_410 * uStack_3c8 + uVar116;
    lVar83 = SUB168(SEXT816((long)uStack_410) * SEXT816((long)uStack_3c8),8) + (lVar121 >> 0x3e) +
             (ulong)CARRY8(uStack_410 * uStack_3c8,uVar116);
    uVar119 = (long)psStack_408 * (long)psStack_3b0;
    lVar82 = SUB168(SEXT816((long)psStack_408) * SEXT816((long)psStack_3b0),8);
    uVar116 = (ulong)(-uVar119 - 1 < uVar66);
    lVar121 = (0x7fffffffffffffff - lVar82) - lVar83;
    psVar86 = (secp256k1_gej *)(lVar121 - uVar116);
    psVar76 = (secp256k1_gej *)0x8000000000000000;
    a_01 = (secp256k1_gej *)((-0x8000000000000000 - lVar82) - (ulong)(uVar119 != 0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar82,lVar83) != SBORROW8(lVar121,uVar116)) ==
              (long)psVar86 < 0;
    if (lVar82 < 0) {
      bVar123 = (SBORROW8(lVar83,(long)a_01) !=
                SBORROW8(lVar83 - (long)a_01,(ulong)(uVar66 < -uVar119))) ==
                (long)((lVar83 - (long)a_01) - (ulong)(uVar66 < -uVar119)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar123;
    if (bVar123 == false) goto LAB_00143b1c;
    uVar116 = uVar66 + uVar119;
    lVar121 = lVar83 + lVar82 + (ulong)CARRY8(uVar66,uVar119);
    uVar1 = (psVar75->x).n[3];
    if (uVar1 == 0) {
LAB_00143804:
      a_01 = (secp256k1_gej *)0x8000000000000000;
      uVar119 = (long)psVar96 << 2 | uVar120 >> 0x3e;
      uVar88 = uStack_400 * (long)psStack_3b8 + uVar119;
      psVar96 = (secp256k1_gej *)
                (((long)psVar96 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_400) * SEXT816((long)psStack_3b8),8) +
                (ulong)CARRY8(uStack_400 * (long)psStack_3b8,uVar119));
      uVar66 = (long)psStack_3f8 * (long)psStack_3c0;
      lVar84 = SUB168(SEXT816((long)psStack_3f8) * SEXT816((long)psStack_3c0),8);
      uVar119 = (ulong)(-uVar66 - 1 < uVar88);
      lVar82 = (0x7fffffffffffffff - lVar84) - (long)psVar96;
      lVar112 = (-0x8000000000000000 - lVar84) - (ulong)(uVar66 != 0);
      lVar83 = (long)psVar96 - lVar112;
      (psStack_3d8->x).n[2] = uVar120 & 0x3fffffffffffffff;
      (psVar91->x).n[2] = uVar116 & 0x3fffffffffffffff;
      bVar123 = (SBORROW8((long)psVar96,lVar112) != SBORROW8(lVar83,(ulong)(uVar88 < -uVar66))) ==
                (long)(lVar83 - (ulong)(uVar88 < -uVar66)) < 0;
      psVar92 = (secp256k1_gej *)(ulong)bVar123;
      bVar58 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
               (long)(lVar82 - uVar119) < 0;
      if (lVar84 < 0) {
        bVar58 = bVar123;
      }
      psVar76 = psStack_3c0;
      psVar86 = psStack_3b8;
      if (!bVar58) goto LAB_00143b21;
      uVar116 = uVar116 >> 0x3e | lVar121 << 2;
      uVar120 = uVar88 + uVar66;
      psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)CARRY8(uVar88,uVar66) + lVar84);
      uVar66 = uStack_410 * (long)psStack_3b8 + uVar116;
      lVar84 = SUB168(SEXT816((long)uStack_410) * SEXT816((long)psStack_3b8),8) + (lVar121 >> 0x3e)
               + (ulong)CARRY8(uStack_410 * (long)psStack_3b8,uVar116);
      uVar119 = (long)psStack_408 * (long)psStack_3c0;
      lVar83 = SUB168(SEXT816((long)psStack_408) * SEXT816((long)psStack_3c0),8);
      uVar116 = (ulong)(-uVar119 - 1 < uVar66);
      lVar121 = (0x7fffffffffffffff - lVar83) - lVar84;
      lVar112 = (-0x8000000000000000 - lVar83) - (ulong)(uVar119 != 0);
      lVar82 = lVar84 - lVar112;
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar121,uVar116)) ==
                (long)(lVar121 - uVar116) < 0;
      if (lVar83 < 0) {
        bVar123 = (SBORROW8(lVar84,lVar112) != SBORROW8(lVar82,(ulong)(uVar66 < -uVar119))) ==
                  (long)(lVar82 - (ulong)(uVar66 < -uVar119)) < 0;
      }
      psVar92 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 == false) goto LAB_00143b26;
      uVar88 = uVar66 + uVar119;
      lVar82 = lVar84 + lVar83 + (ulong)CARRY8(uVar66,uVar119);
      uVar1 = (psVar75->x).n[4];
      uVar119 = uVar1 * lStack_3e8;
      psVar92 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3e8),8);
      uVar116 = (ulong)(-uVar119 - 1 < uVar120);
      lVar121 = (0x7fffffffffffffff - (long)psVar92) - (long)psVar96;
      psVar122 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar92) - (ulong)(uVar119 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - (long)psVar92,(long)psVar96) !=
                SBORROW8(lVar121,uVar116)) == (long)(lVar121 - uVar116) < 0;
      if ((long)psVar92 < 0) {
        bVar123 = (SBORROW8((long)psVar96,(long)psVar122) !=
                  SBORROW8((long)psVar96 - (long)psVar122,(ulong)(uVar120 < -uVar119))) ==
                  (long)(((long)psVar96 - (long)psVar122) - (ulong)(uVar120 < -uVar119)) < 0;
      }
      if (!bVar123) goto LAB_00143b2b;
      uVar66 = uVar1 * (long)psVar85;
      lVar83 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar85),8);
      psVar86 = (secp256k1_gej *)0x8000000000000000;
      uVar116 = (ulong)(-uVar66 - 1 < uVar88);
      lVar121 = (0x7fffffffffffffff - lVar83) - lVar82;
      a_01 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar66 != 0));
      bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar82) != SBORROW8(lVar121,uVar116)) ==
                (long)(lVar121 - uVar116) < 0;
      if (lVar83 < 0) {
        bVar123 = (SBORROW8(lVar82,(long)a_01) !=
                  SBORROW8(lVar82 - (long)a_01,(ulong)(uVar88 < -uVar66))) ==
                  (long)((lVar82 - (long)a_01) - (ulong)(uVar88 < -uVar66)) < 0;
      }
      psVar76 = (secp256k1_gej *)(ulong)bVar123;
      if (bVar123 == false) goto LAB_00143b30;
      lVar84 = (long)(psVar92->x).n + (ulong)CARRY8(uVar119,uVar120) + (long)(psVar96->x).n;
      lVar121 = lVar83 + lVar82 + (ulong)CARRY8(uVar66,uVar88);
      psVar76 = (secp256k1_gej *)(lVar84 * 4 | uVar119 + uVar120 >> 0x3e);
      (psStack_3d8->x).n[3] = uVar119 + uVar120 & 0x3fffffffffffffff;
      (psVar91->x).n[3] = uVar66 + uVar88 & 0x3fffffffffffffff;
      psVar96 = (secp256k1_gej *)&psVar76[0xd79435e50d7943].x.magnitude;
      psVar92 = (secp256k1_gej *)
                ((lVar84 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar76));
      if (psVar92 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_00143b35;
      psVar92 = (secp256k1_gej *)0xffffffffffffffff;
      uVar116 = uVar66 + uVar88 >> 0x3e | lVar121 * 4;
      (psStack_3d8->x).n[4] = (uint64_t)psVar76;
      psVar86 = (secp256k1_gej *)(uVar116 + 0x8000000000000000);
      if ((lVar121 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar116) != -1) goto LAB_00143b3a;
      (psVar91->x).n[4] = uVar116;
      psVar92 = (secp256k1_gej *)0x5;
      psVar76 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_418 = (secp256k1_gej *)0x143a54;
      psVar96 = psStack_3d8;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psStack_3d8,5,
                          (secp256k1_modinv64_signed62 *)psVar75,-2);
      if (iVar64 < 1) goto LAB_00143b3f;
      psVar76 = (secp256k1_gej *)0x1;
      psVar92 = (secp256k1_gej *)0x5;
      psStack_418 = (secp256k1_gej *)0x143a71;
      psVar96 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,5,
                          (secp256k1_modinv64_signed62 *)psVar75,1);
      if (-1 < iVar64) goto LAB_00143b44;
      psVar92 = (secp256k1_gej *)0x5;
      psVar76 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_418 = (secp256k1_gej *)0x143a90;
      psVar96 = psVar91;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar91,5,
                          (secp256k1_modinv64_signed62 *)psVar75,-2);
      if (iVar64 < 1) goto LAB_00143b49;
      psVar76 = (secp256k1_gej *)0x1;
      psVar92 = (secp256k1_gej *)0x5;
      psStack_418 = (secp256k1_gej *)0x143aad;
      psVar96 = psVar91;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar91,5,
                          (secp256k1_modinv64_signed62 *)psVar75,1);
      if (iVar64 < 0) {
        return;
      }
      goto LAB_00143b4e;
    }
    psVar86 = (secp256k1_gej *)(uVar1 * lStack_3e8);
    lVar83 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_3e8),8);
    uVar119 = (ulong)(-(long)psVar86 - 1U < uVar120);
    lVar82 = (0x7fffffffffffffff - lVar83) - (long)psVar96;
    a_01 = (secp256k1_gej *)0x8000000000000000;
    psVar92 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar83) - (ulong)(psVar86 != (secp256k1_gej *)0x0));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar96) != SBORROW8(lVar82,uVar119)) ==
              (long)(lVar82 - uVar119) < 0;
    if (lVar83 < 0) {
      bVar123 = (SBORROW8((long)psVar96,(long)psVar92) !=
                SBORROW8((long)psVar96 - (long)psVar92,(ulong)(uVar120 < (ulong)-(long)psVar86))) ==
                (long)(((long)psVar96 - (long)psVar92) - (ulong)(uVar120 < (ulong)-(long)psVar86)) <
                0;
    }
    psVar67 = psStack_3d8;
    if (!bVar123) goto LAB_00143b67;
    uVar66 = uVar1 * (long)psVar85;
    lVar112 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar85),8);
    uVar119 = (ulong)(-uVar66 - 1 < uVar116);
    lVar82 = (0x7fffffffffffffff - lVar112) - lVar121;
    lVar118 = (-0x8000000000000000 - lVar112) - (ulong)(uVar66 != 0);
    lVar84 = lVar121 - lVar118;
    psVar67 = (secp256k1_gej *)(lVar84 - (ulong)(uVar116 < -uVar66));
    bVar123 = (SBORROW8(0x7fffffffffffffff - lVar112,lVar121) != SBORROW8(lVar82,uVar119)) ==
              (long)(lVar82 - uVar119) < 0;
    if (lVar112 < 0) {
      bVar123 = (SBORROW8(lVar121,lVar118) != SBORROW8(lVar84,(ulong)(uVar116 < -uVar66))) ==
                (long)psVar67 < 0;
    }
    uVar95 = (uint)bVar123;
    if (bVar123 != false) {
      bVar123 = CARRY8(uVar120,(ulong)psVar86);
      uVar120 = (long)(psVar86->x).n + uVar120;
      psVar96 = (secp256k1_gej *)((long)(psVar96->x).n + (ulong)bVar123 + lVar83);
      bVar123 = CARRY8(uVar116,uVar66);
      uVar116 = uVar116 + uVar66;
      lVar121 = lVar121 + lVar112 + (ulong)bVar123;
      goto LAB_00143804;
    }
  }
  psStack_418 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_02 = &sStack_478;
  psStack_428 = psVar86;
  psStack_420 = a_01;
  psStack_418 = psVar67;
  secp256k1_modinv64_mul_62(&sStack_450,(secp256k1_modinv64_signed62 *)psVar96,uVar95,1);
  psVar89 = a;
  secp256k1_modinv64_mul_62(&sStack_478,a,5,(int64_t)psVar85);
  lVar121 = 0;
  while ((ulong)sStack_450.v[lVar121] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_478.v[lVar121]) goto LAB_00143c01;
    lVar121 = lVar121 + 1;
    if (lVar121 == 4) {
      uVar95 = 4;
      while( true ) {
        if (sStack_450.v[uVar95] < sStack_478.v[uVar95]) {
          return;
        }
        if (sStack_478.v[uVar95] < sStack_450.v[uVar95]) break;
        bVar123 = uVar95 == 0;
        uVar95 = uVar95 - 1;
        if (bVar123) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00143c01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar64 = (int)a_02;
  if (iVar64 < 1) {
LAB_00143ec0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00143ec5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00143eca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00143ecf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00143ed4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00143ed9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar85->x).n[0];
    uVar2 = (psVar85->x).n[1];
    lVar121 = psVar89->v[0];
    lVar82 = *extraout_RDX_00;
    uVar116 = lVar121 * uVar1;
    lVar84 = SUB168(SEXT816(lVar121) * SEXT816((long)uVar1),8);
    uVar119 = lVar82 * uVar2;
    lVar112 = SUB168(SEXT816(lVar82) * SEXT816((long)uVar2),8);
    lVar83 = (0x7fffffffffffffff - lVar112) - lVar84;
    if (-1 < lVar112 &&
        (SBORROW8(0x7fffffffffffffff - lVar112,lVar84) !=
        SBORROW8(lVar83,(ulong)(~uVar119 < uVar116))) !=
        (long)(lVar83 - (ulong)(~uVar119 < uVar116)) < 0) goto LAB_00143ec5;
    uVar3 = (psVar85->x).n[2];
    lVar84 = lVar112 + lVar84 + (ulong)CARRY8(uVar119,uVar116);
    uVar4 = (psVar85->x).n[3];
    uVar88 = lVar121 * uVar3;
    lVar83 = SUB168(SEXT816(lVar121) * SEXT816((long)uVar3),8);
    uVar120 = lVar82 * uVar4;
    lVar82 = SUB168(SEXT816(lVar82) * SEXT816((long)uVar4),8);
    uVar66 = (ulong)(-uVar120 - 1 < uVar88);
    lVar121 = (0x7fffffffffffffff - lVar82) - lVar83;
    if (-1 < lVar82 &&
        (SBORROW8(0x7fffffffffffffff - lVar82,lVar83) != SBORROW8(lVar121,uVar66)) !=
        (long)(lVar121 - uVar66) < 0) goto LAB_00143eca;
    lVar121 = lVar82 + lVar83 + (ulong)CARRY8(uVar120,uVar88);
    if ((uVar119 + uVar116 & 0x3fffffffffffffff) != 0) goto LAB_00143ecf;
    if ((uVar120 + uVar88 & 0x3fffffffffffffff) != 0) goto LAB_00143ed4;
    uVar66 = uVar120 + uVar88 >> 0x3e | lVar121 * 4;
    uVar116 = uVar119 + uVar116 >> 0x3e | lVar84 * 4;
    lVar121 = lVar121 >> 0x3e;
    lVar84 = lVar84 >> 0x3e;
    if (iVar64 != 1) {
      psVar70 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & 0xffffffff);
      a_02 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar82 = psVar89->v[(long)a_02];
        uVar88 = lVar82 * uVar1 + uVar116;
        lVar87 = SUB168(SEXT816(lVar82) * SEXT816((long)uVar1),8) + lVar84 +
                 (ulong)CARRY8(lVar82 * uVar1,uVar116);
        lVar83 = extraout_RDX_00[(long)a_02];
        uVar119 = lVar83 * uVar2;
        lVar118 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar2),8);
        uVar116 = (ulong)(-uVar119 - 1 < uVar88);
        lVar84 = (0x7fffffffffffffff - lVar118) - lVar87;
        psVar93 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar115 = (-0x8000000000000000 - lVar118) - (ulong)(uVar119 != 0);
        lVar112 = lVar87 - lVar115;
        bVar123 = (SBORROW8(0x7fffffffffffffff - lVar118,lVar87) != SBORROW8(lVar84,uVar116)) ==
                  (long)(lVar84 - uVar116) < 0;
        if (lVar118 < 0) {
          bVar123 = (SBORROW8(lVar87,lVar115) != SBORROW8(lVar112,(ulong)(uVar88 < -uVar119))) ==
                    (long)(lVar112 - (ulong)(uVar88 < -uVar119)) < 0;
        }
        if (!bVar123) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00143ebb:
          psVar89 = psVar93;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00143ec0;
        }
        uVar109 = lVar82 * uVar3 + uVar66;
        lVar112 = SUB168(SEXT816(lVar82) * SEXT816((long)uVar3),8) + lVar121 +
                  (ulong)CARRY8(lVar82 * uVar3,uVar66);
        uVar120 = lVar83 * uVar4;
        lVar83 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar4),8);
        uVar116 = (ulong)(-uVar120 - 1 < uVar109);
        lVar121 = (0x7fffffffffffffff - lVar83) - lVar112;
        lVar84 = (-0x8000000000000000 - lVar83) - (ulong)(uVar120 != 0);
        lVar82 = lVar112 - lVar84;
        bVar123 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar112) != SBORROW8(lVar121,uVar116)) ==
                  (long)(lVar121 - uVar116) < 0;
        if (lVar83 < 0) {
          bVar123 = (SBORROW8(lVar112,lVar84) != SBORROW8(lVar82,(ulong)(uVar109 < -uVar120))) ==
                    (long)(lVar82 - (ulong)(uVar109 < -uVar120)) < 0;
        }
        if (!bVar123) goto LAB_00143ebb;
        lVar84 = lVar118 + lVar87 + (ulong)CARRY8(uVar119,uVar88);
        lVar121 = lVar83 + lVar112 + (ulong)CARRY8(uVar120,uVar109);
        uVar116 = lVar84 * 4 | uVar119 + uVar88 >> 0x3e;
        psVar89->v[(long)((long)a_02[-1].v + 0x27)] = uVar119 + uVar88 & 0x3fffffffffffffff;
        uVar66 = lVar121 * 4 | uVar120 + uVar109 >> 0x3e;
        extraout_RDX_00[(long)((long)a_02[-1].v + 0x27)] = uVar120 + uVar109 & 0x3fffffffffffffff;
        a_02 = (secp256k1_modinv64_signed62 *)((long)a_02->v + 1);
        lVar121 = lVar121 >> 0x3e;
        lVar84 = lVar84 >> 0x3e;
      } while (psVar70 != a_02);
    }
    if (lVar84 + -1 + (ulong)(0x7fffffffffffffff < uVar116) != -1) goto LAB_00143ed9;
    psVar89->v[(long)iVar64 + -1] = uVar116;
    if (lVar121 + -1 + (ulong)(0x7fffffffffffffff < uVar66) == -1) {
      extraout_RDX_00[(long)iVar64 + -1] = uVar66;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar121 = a_02->v[0];
  lVar82 = a_02->v[1];
  lVar83 = a_02->v[2];
  lVar84 = a_02->v[3];
  lVar112 = a_02->v[4];
  lVar118 = 0;
  do {
    if (a_02->v[lVar118] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014410f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00144114;
    }
    if (0x3fffffffffffffff < a_02->v[lVar118]) goto LAB_0014410f;
    lVar118 = lVar118 + 1;
  } while (lVar118 != 5);
  iVar64 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,-2);
  if (iVar64 < 1) {
LAB_00144114:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00144119:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014411e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar64 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
    if (-1 < iVar64) goto LAB_00144119;
    uVar116 = lVar112 >> 0x3f;
    uVar88 = (long)psVar89 >> 0x3f;
    uVar119 = ((uVar116 & b->v[0]) + lVar121 ^ uVar88) - uVar88;
    uVar120 = ((long)uVar119 >> 0x3e) + (((uVar116 & b->v[1]) + lVar82 ^ uVar88) - uVar88);
    uVar109 = ((long)uVar120 >> 0x3e) + ((lVar83 + (uVar116 & b->v[2]) ^ uVar88) - uVar88);
    uVar66 = ((long)uVar109 >> 0x3e) + (((uVar116 & b->v[3]) + lVar84 ^ uVar88) - uVar88);
    lVar121 = ((long)uVar66 >> 0x3e) + (((uVar116 & b->v[4]) + lVar112 ^ uVar88) - uVar88);
    uVar88 = lVar121 >> 0x3f;
    uVar116 = (b->v[0] & uVar88) + (uVar119 & 0x3fffffffffffffff);
    uVar120 = ((long)uVar116 >> 0x3e) + (b->v[1] & uVar88) + (uVar120 & 0x3fffffffffffffff);
    uVar119 = ((long)uVar120 >> 0x3e) + (b->v[2] & uVar88) + (uVar109 & 0x3fffffffffffffff);
    uVar66 = ((long)uVar119 >> 0x3e) + (b->v[3] & uVar88) + (uVar66 & 0x3fffffffffffffff);
    uVar88 = (b->v[4] & uVar88) + lVar121 + ((long)uVar66 >> 0x3e);
    a_02->v[0] = uVar116 & 0x3fffffffffffffff;
    a_02->v[1] = uVar120 & 0x3fffffffffffffff;
    a_02->v[2] = uVar119 & 0x3fffffffffffffff;
    a_02->v[3] = uVar66 & 0x3fffffffffffffff;
    a_02->v[4] = uVar88;
    if (0x3fffffffffffffff < uVar88) goto LAB_0014411e;
    iVar64 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,0);
    if (-1 < iVar64) {
      iVar64 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
      if (iVar64 < 0) {
        return;
      }
      goto LAB_00144128;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00144128:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}